

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O2

vector<LongReadMapping,_std::allocator<LongReadMapping>_> * __thiscall
LongReadsMapper::filter_and_chain_matches_by_offset_group
          (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__return_storage_ptr__,
          LongReadsMapper *this,vector<LongReadMapping,_std::allocator<LongReadMapping>_> *matches,
          bool verbose)

{
  int iVar1;
  int iVar2;
  pointer pLVar3;
  _Bit_type *p_Var4;
  LongReadMapping *pLVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  match_band *m_1;
  ostream *poVar9;
  pointer pmVar10;
  ulong uVar11;
  pointer pLVar12;
  undefined7 in_register_00000009;
  int32_t iVar13;
  int iVar14;
  _Bit_type *p_Var15;
  int mi;
  long lVar16;
  pointer pmVar17;
  LongReadMapping *m_00;
  int iVar18;
  char *pcVar19;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__range2;
  LongReadMapping *m;
  pointer pmVar20;
  long lVar21;
  ulong uVar22;
  reference rVar23;
  bool local_cd;
  int local_cc;
  vector<match_band,_std::allocator<match_band>_> mbo;
  match_band local_a8;
  vector<match_band,_std::allocator<match_band>_> filtered_mbo;
  vector<bool,_std::allocator<bool>_> used;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__range2_2;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__range1;
  
  local_cc = (int)CONCAT71(in_register_00000009,verbose);
  if (local_cc != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"Filtering matches:");
    std::endl<char,std::char_traits<char>>(poVar9);
    pLVar3 = (matches->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (pLVar12 = (matches->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
                   _M_impl.super__Vector_impl_data._M_start; pLVar12 != pLVar3;
        pLVar12 = pLVar12 + 1) {
      poVar9 = ::operator<<((ostream *)&std::cout,pLVar12);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
  }
  mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pLVar12 = (matches->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl
            .super__Vector_impl_data._M_start;
  pLVar3 = (matches->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar16 = pLVar12->node;
  lVar21 = -lVar16;
  if (0 < lVar16) {
    lVar21 = lVar16;
  }
  for (; pmVar10 = mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                   super__Vector_impl_data._M_start, pLVar12 != pLVar3; pLVar12 = pLVar12 + 1) {
    local_cd = lVar21 == pLVar12->node;
    used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT44(used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_start.super__Bit_iterator_base._M_p._4_4_,pLVar12->qStart - pLVar12->nStart);
    filtered_mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(filtered_mbo.super__Vector_base<match_band,_std::allocator<match_band>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           pLVar12->qEnd - pLVar12->nEnd);
    local_a8._0_4_ = pLVar12->nEnd - pLVar12->nStart;
    std::vector<match_band,std::allocator<match_band>>::emplace_back<bool,int,int,int,int_const&>
              ((vector<match_band,std::allocator<match_band>> *)&mbo,&local_cd,(int *)&used,
               (int *)&filtered_mbo,(int *)&local_a8,&pLVar12->score);
  }
  for (; pmVar10 !=
         mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
         super__Vector_impl_data._M_finish; pmVar10 = pmVar10 + 1) {
    iVar8 = pmVar10->min_offset;
    iVar18 = pmVar10->max_offset;
    iVar14 = iVar8;
    if (iVar18 < iVar8) {
      iVar14 = iVar18;
    }
    if (iVar18 < iVar8) {
      iVar18 = iVar8;
    }
    pmVar10->min_offset = iVar14 + -200;
    pmVar10->max_offset = iVar18 + 200;
  }
  if ((char)local_cc != '\0') {
    poVar9 = std::operator<<((ostream *)&std::cout,"Orientations, offsets, lengths and scores:");
    std::endl<char,std::char_traits<char>>(poVar9);
    pmVar10 = mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pmVar20 = mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                   super__Vector_impl_data._M_start; pmVar20 != pmVar10; pmVar20 = pmVar20 + 1) {
      pcVar19 = "false";
      if (pmVar20->dir != false) {
        pcVar19 = "true";
      }
      poVar9 = std::operator<<((ostream *)&std::cout,pcVar19);
      poVar9 = std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pmVar20->min_offset);
      poVar9 = std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pmVar20->max_offset);
      poVar9 = std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pmVar20->len);
      poVar9 = std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pmVar20->score);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
  }
  uVar22 = ((long)mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0x14 + 1;
  while( true ) {
    pmVar20 = mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pmVar10 = mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar16 = (long)mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar11 = lVar16 / 0x14;
    if (uVar22 <= uVar11) break;
    filtered_mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)filtered_mbo.super__Vector_base<match_band,_std::allocator<match_band>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)
               &used.super__Bvector_base<std::allocator<bool>_>,uVar11,(bool *)&filtered_mbo,
               (allocator_type *)&local_a8);
    filtered_mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    filtered_mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    filtered_mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar11 = 0;
        uVar22 = ((long)mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x14, uVar11 < uVar22;
        uVar11 = uVar11 + 1) {
      rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          &used.super__Bvector_base<std::allocator<bool>_>,uVar11);
      if ((*rVar23._M_p & rVar23._M_mask) == 0) {
        rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            &used.super__Bvector_base<std::allocator<bool>_>,uVar11);
        *rVar23._M_p = *rVar23._M_p | rVar23._M_mask;
        pmVar10 = mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar11;
        local_a8.dir = pmVar10->dir;
        local_a8._1_3_ = *(undefined3 *)&pmVar10->field_0x1;
        local_a8.min_offset = pmVar10->min_offset;
        uVar6 = pmVar10->max_offset;
        uVar7 = pmVar10->len;
        local_a8.score =
             mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11].score;
        lVar16 = 0xc;
        local_a8.max_offset = uVar6;
        local_a8.len = uVar7;
        for (uVar22 = 0;
            uVar22 < (ulong)(((long)mbo.super__Vector_base<match_band,_std::allocator<match_band>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)mbo.super__Vector_base<match_band,_std::allocator<match_band>_>.
                                   _M_impl.super__Vector_impl_data._M_start) / 0x14);
            uVar22 = uVar22 + 1) {
          rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              &used.super__Bvector_base<std::allocator<bool>_>,uVar22);
          if ((*rVar23._M_p & rVar23._M_mask) == 0) {
            iVar8 = *(int *)((long)mbo.super__Vector_base<match_band,_std::allocator<match_band>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar16 + -4);
            if ((local_a8.min_offset < iVar8) &&
               (iVar18 = *(int *)((long)mbo.
                                        super__Vector_base<match_band,_std::allocator<match_band>_>.
                                        _M_impl.super__Vector_impl_data._M_start + lVar16 + -8),
               iVar18 < local_a8.max_offset)) {
              iVar13 = local_a8.min_offset;
              if (iVar18 < local_a8.min_offset) {
                iVar13 = iVar18;
              }
              local_a8.min_offset = iVar13;
              if (iVar8 < local_a8.max_offset) {
                iVar8 = local_a8.max_offset;
              }
              local_a8.len = local_a8.len +
                             (int)*(undefined8 *)
                                   (&(mbo.
                                      super__Vector_base<match_band,_std::allocator<match_band>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->dir + lVar16);
              local_a8.score =
                   local_a8.score +
                   (int)((ulong)*(undefined8 *)
                                 (&(mbo.super__Vector_base<match_band,_std::allocator<match_band>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->dir + lVar16) >> 0x20
                        );
              local_a8.max_offset = iVar8;
              rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)
                                  &used.super__Bvector_base<std::allocator<bool>_>,uVar22);
              *rVar23._M_p = *rVar23._M_p | rVar23._M_mask;
            }
          }
          lVar16 = lVar16 + 0x14;
        }
        std::vector<match_band,std::allocator<match_band>>::emplace_back<match_band&>
                  ((vector<match_band,std::allocator<match_band>> *)&filtered_mbo,&local_a8);
      }
    }
    std::vector<match_band,_std::allocator<match_band>_>::operator=(&mbo,&filtered_mbo);
    std::_Vector_base<match_band,_std::allocator<match_band>_>::~_Vector_base
              ((_Vector_base<match_band,_std::allocator<match_band>_> *)&filtered_mbo);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&used.super__Bvector_base<std::allocator<bool>_>);
  }
  if (mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
      super__Vector_impl_data._M_start !=
      mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar21 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar21 == 0; lVar21 = lVar21 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<match_band*,std::vector<match_band,std::allocator<match_band>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<LongReadsMapper::filter_and_chain_matches_by_offset_group(std::vector<LongReadMapping,std::allocator<LongReadMapping>>&,bool)const::__0>>
              (mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
               super__Vector_impl_data._M_start,
               mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar16 < 0x141) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<match_band*,std::vector<match_band,std::allocator<match_band>>>,__gnu_cxx::__ops::_Iter_comp_iter<LongReadsMapper::filter_and_chain_matches_by_offset_group(std::vector<LongReadMapping,std::allocator<LongReadMapping>>&,bool)const::__0>>
                (pmVar10,pmVar20);
    }
    else {
      pmVar17 = pmVar10 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<match_band*,std::vector<match_band,std::allocator<match_band>>>,__gnu_cxx::__ops::_Iter_comp_iter<LongReadsMapper::filter_and_chain_matches_by_offset_group(std::vector<LongReadMapping,std::allocator<LongReadMapping>>&,bool)const::__0>>
                (pmVar10,pmVar17);
      for (; pmVar17 != pmVar20; pmVar17 = pmVar17 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<match_band*,std::vector<match_band,std::allocator<match_band>>>,__gnu_cxx::__ops::_Val_comp_iter<LongReadsMapper::filter_and_chain_matches_by_offset_group(std::vector<LongReadMapping,std::allocator<LongReadMapping>>&,bool)const::__0>>
                  (pmVar17);
      }
    }
  }
  if ((char)local_cc != '\0') {
    std::operator<<((ostream *)&std::cout,
                    "Consolidated orientations, offsets, lengths and scores:\n");
    pmVar10 = mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pmVar20 = mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                   super__Vector_impl_data._M_start; pmVar20 != pmVar10; pmVar20 = pmVar20 + 1) {
      pcVar19 = "false";
      if (pmVar20->dir != false) {
        pcVar19 = "true";
      }
      poVar9 = std::operator<<((ostream *)&std::cout,pcVar19);
      poVar9 = std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pmVar20->min_offset);
      poVar9 = std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pmVar20->max_offset);
      poVar9 = std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pmVar20->len);
      poVar9 = std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pmVar20->score);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
  }
  pmVar10 = mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
            super__Vector_impl_data._M_finish;
  filtered_mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  filtered_mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  filtered_mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar8 = (mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
           super__Vector_impl_data._M_start)->score;
  for (pmVar20 = mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                 super__Vector_impl_data._M_start; pmVar20 != pmVar10; pmVar20 = pmVar20 + 1) {
    if ((float)iVar8 * 0.5 <= (float)pmVar20->score) {
      std::vector<match_band,_std::allocator<match_band>_>::push_back(&filtered_mbo,pmVar20);
    }
  }
  if ((char)local_cc != '\0') {
    std::operator<<((ostream *)&std::cout,"Filtered orientations, offsets, lengths and scores:\n");
    pmVar10 = filtered_mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pmVar20 = filtered_mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                   super__Vector_impl_data._M_start; pmVar20 != pmVar10; pmVar20 = pmVar20 + 1) {
      pcVar19 = "false";
      if (pmVar20->dir != false) {
        pcVar19 = "true";
      }
      poVar9 = std::operator<<((ostream *)&std::cout,pcVar19);
      poVar9 = std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pmVar20->min_offset);
      poVar9 = std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pmVar20->max_offset);
      poVar9 = std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pmVar20->len);
      poVar9 = std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pmVar20->score);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
  }
  pmVar10 = filtered_mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pmVar20 = filtered_mbo.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                 super__Vector_impl_data._M_start; pmVar20 != pmVar10; pmVar20 = pmVar20 + 1) {
    used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._12_4_ = 0;
    used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x80000000;
    pLVar12 = (matches->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
              _M_impl.super__Vector_impl_data._M_start;
    used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._12_4_ = 0x7fffffff;
    used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = pLVar12->read_id;
    p_Var4 = (_Bit_type *)pLVar12->node;
    p_Var15 = (_Bit_type *)-(long)p_Var4;
    if (0 < (long)p_Var4) {
      p_Var15 = p_Var4;
    }
    used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)-(long)p_Var15;
    if (pmVar20->dir != false) {
      used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = p_Var15;
    }
    iVar8 = 0x7fffffff;
    iVar18 = -0x80000000;
    iVar14 = 0;
    for (; pLVar12 !=
           (matches->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
           super__Vector_impl_data._M_finish; pLVar12 = pLVar12 + 1) {
      iVar1 = pLVar12->nStart;
      if (pmVar20->min_offset <= pLVar12->qStart - iVar1) {
        iVar2 = pLVar12->nEnd;
        if (pLVar12->qEnd - iVar2 <= pmVar20->max_offset) {
          if (iVar1 < iVar8) {
            used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._12_4_ = iVar1;
            used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p =
                 (_Bit_type *)
                 CONCAT44(pLVar12->qStart,
                          used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._0_4_);
            iVar8 = iVar1;
          }
          if (iVar18 < iVar2) {
            used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p =
                 (_Bit_type *)
                 CONCAT44(used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._4_4_,
                          iVar2);
            used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._12_4_ = 0;
            used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset = pLVar12->qEnd;
            iVar18 = iVar2;
          }
          iVar14 = iVar14 + pLVar12->score;
          used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
          .super__Bit_iterator_base._12_4_ = iVar14;
        }
      }
    }
    std::vector<LongReadMapping,std::allocator<LongReadMapping>>::emplace_back<LongReadMapping&>
              ((vector<LongReadMapping,std::allocator<LongReadMapping>> *)__return_storage_ptr__,
               (LongReadMapping *)&used);
  }
  if ((char)local_cc != '\0') {
    poVar9 = std::operator<<((ostream *)&std::cout,"Filtered matches:");
    std::endl<char,std::char_traits<char>>(poVar9);
    pLVar5 = (__return_storage_ptr__->
             super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (m_00 = (__return_storage_ptr__->
                super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
                super__Vector_impl_data._M_start; m_00 != pLVar5; m_00 = m_00 + 1) {
      poVar9 = ::operator<<((ostream *)&std::cout,m_00);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
  }
  std::_Vector_base<match_band,_std::allocator<match_band>_>::~_Vector_base
            (&filtered_mbo.super__Vector_base<match_band,_std::allocator<match_band>_>);
  std::_Vector_base<match_band,_std::allocator<match_band>_>::~_Vector_base
            (&mbo.super__Vector_base<match_band,_std::allocator<match_band>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<LongReadMapping>
LongReadsMapper::filter_and_chain_matches_by_offset_group(std::vector<LongReadMapping> &matches, bool verbose) const {

    const int32_t OFFSET_BANDWITDH=200;
    if (verbose){
        std::cout<<"Filtering matches:" << std::endl;
        for (const auto &m : matches)
            std::cout << m << std::endl;
    }


    std::vector<match_band> mbo;
    auto node = std::abs(matches[0].node);
    for (const auto &m : matches ){
        mbo.emplace_back(node == m.node, m.qStart-m.nStart, m.qEnd-m.nEnd, m.nEnd-m.nStart, m.score);
    }

    for (auto &m : mbo) {
        auto mino=std::min(m.min_offset,m.max_offset)-OFFSET_BANDWITDH;
        auto maxo=std::max(m.min_offset, m.max_offset)+OFFSET_BANDWITDH;
        m.min_offset = mino;
        m.max_offset = maxo;
    }

    if (verbose){
        std::cout << "Orientations, offsets, lengths and scores:" << std::endl;
        for (const auto &m : mbo){
            std::cout << ((m.dir) ? "true":"false") << ", " << m.min_offset << ", " << m.max_offset << ", " << m.len << ", " << m.score << std::endl;
        }
    }

    auto prev_len = mbo.size()+1;

    while (mbo.size() < prev_len) {
        auto used = std::vector<bool>(mbo.size(), false);
        std::vector<match_band> new_mbo;

        for (int mi=0; mi < mbo.size(); mi++) {
            if (used[mi]){continue;}
            used[mi] = true;
            auto m = mbo[mi];
            for (int mi2 = 0; mi2 < mbo.size(); mi2++) {
                if (used[mi2]){continue;}
                auto m2 = mbo[mi2];
                if (m.min_offset<m2.max_offset and m2.min_offset < m.max_offset){
                    m.min_offset = std::min(m.min_offset,m2.min_offset);
                    m.max_offset = std::max(m.max_offset,m2.max_offset);
                    m.len += m2.len;
                    m.score += m2.score;
                    used[mi2] = true;
                }
            }
            new_mbo.emplace_back(m);
        }
        prev_len = mbo.size();
        mbo = new_mbo;
    }

    std::sort(mbo.begin(), mbo.end(), [](match_band &ma, match_band &mb){return ma.score > mb.score;});

    if (verbose){
        std::cout << "Consolidated orientations, offsets, lengths and scores:\n";
        for (const auto &m : mbo){
            std::cout << ((m.dir) ? "true":"false") << ", " << m.min_offset << ", " << m.max_offset << ", " << m.len << ", " << m.score << std::endl;
        }
    }

    std::vector<match_band> filtered_mbo;
    auto max_score = mbo[0].score;
    std::copy_if(mbo.begin(), mbo.end(), std::back_inserter(filtered_mbo), [max_score](match_band &m){ return m.score >= 0.5f*max_score; });

    if (verbose){
        std::cout << "Filtered orientations, offsets, lengths and scores:\n";
        for (const auto &m : filtered_mbo){
            std::cout << ((m.dir) ? "true":"false") << ", " << m.min_offset << ", " << m.max_offset << ", " << m.len << ", " << m.score << std::endl;
        }
    }

    // Create matches min, max positions for each band that has passed the filter
    std::vector<LongReadMapping> filtered_matches;

    for (const auto &mb : filtered_mbo) {
        LongReadMapping chained;
        chained.nStart=INT32_MAX;
        chained.nEnd=INT32_MIN;
        chained.score=0;
        chained.read_id=matches[0].read_id;
        chained.node=mb.dir ? std::abs(matches[0].node) : -std::abs(matches[0].node);
        for (const auto &m : matches) {
            if ((m.qStart - m.nStart) >= mb.min_offset and (m.qEnd - m.nEnd) <= mb.max_offset) {
                if (chained.nStart>m.nStart){
                    chained.nStart=m.nStart;
                    chained.qStart=m.qStart;
                }
                if (chained.nEnd<m.nEnd){
                    chained.nEnd=m.nEnd;
                    chained.qEnd=m.qEnd;
                }
                chained.score+=m.score;
            }
        }
        filtered_matches.emplace_back(chained);
    }

    if (verbose){
        std::cout<<"Filtered matches:" << std::endl;
        for (const auto &m : filtered_matches)
            std::cout << m << std::endl;
    }

    return filtered_matches;
}